

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do_more(connectdata *conn,int *completep)

{
  SessionHandle *data;
  void *pvVar1;
  SessionHandle *pSVar2;
  ftpstate newstate;
  CURLcode CVar3;
  uint remote_port;
  ushort **ppuVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  _Bool _Var8;
  char *pcVar9;
  ulong uVar10;
  byte *__nptr;
  _Bool connected;
  _Bool complete;
  long local_d8;
  SessionHandle *local_d0;
  void *local_c8;
  byte *local_c0;
  _Bool serv_conned;
  undefined7 uStack_b7;
  
  data = conn->data;
  CVar3 = CURLE_OK;
  connected = false;
  complete = false;
  pvVar1 = (data->req).protop;
  if ((conn->bits).tcpconnect[1] != false) goto LAB_00482b06;
  if (conn->tunnel_state[1] == TUNNEL_CONNECT) {
    CVar3 = Curl_proxyCONNECT(conn,1,(char *)0x0,0);
    return CVar3;
  }
  CVar3 = Curl_is_connected(conn,1,&connected);
  if (connected != true) {
    if (CVar3 == CURLE_OK) {
      return CURLE_OK;
    }
    if ((conn->proto).ftpc.count1 == 0) {
      *completep = -1;
      CVar3 = ftp_epsv_disable(conn);
      return CVar3;
    }
    return CVar3;
  }
  if ((conn->bits).proxy != true) goto LAB_00482b06;
  CVar3 = CURLE_OK;
  Curl_infof(data,"Connection to proxy confirmed\n");
  local_d0 = (SessionHandle *)(conn->proto).ftpc.newhost;
  remote_port = (uint)(conn->proto).ftpc.newport;
  local_d8 = CONCAT44(local_d8._4_4_,remote_port);
  pSVar2 = conn->data;
  connected = false;
  switch(conn->proxytype) {
  case CURLPROXY_HTTP:
  case CURLPROXY_HTTP_1_0:
    break;
  default:
    Curl_failf(pSVar2,"unknown proxytype option given");
    CVar3 = CURLE_COULDNT_CONNECT;
    break;
  case CURLPROXY_SOCKS4:
    pcVar9 = conn->proxyuser;
    _Var8 = false;
    goto LAB_00482e98;
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    CVar3 = Curl_SOCKS5(conn->proxyuser,conn->proxypasswd,(char *)local_d0,remote_port,1,conn);
    goto LAB_00482e9d;
  case CURLPROXY_SOCKS4A:
    pcVar9 = conn->proxyuser;
    _Var8 = true;
LAB_00482e98:
    CVar3 = Curl_SOCKS4(pcVar9,(char *)local_d0,remote_port,1,conn,_Var8);
LAB_00482e9d:
    connected = true;
  }
  if (((conn->bits).tunnel_proxy == true) && ((conn->bits).httpproxy == true)) {
    local_c8 = (pSVar2->req).protop;
    memset(&serv_conned,0,0x88);
    (pSVar2->req).protop = &serv_conned;
    CVar3 = Curl_proxyCONNECT(conn,1,(char *)local_d0,(int)local_d8);
    (pSVar2->req).protop = local_c8;
    if (CVar3 == CURLE_OK) {
      if (conn->tunnel_state[1] == TUNNEL_COMPLETE) {
        connected = true;
        CVar3 = CURLE_OK;
      }
      else {
        (conn->proto).ftpc.state = FTP_STOP;
      }
    }
  }
LAB_00482b06:
  if ((conn->proto).ftpc.state == FTP_STOP) {
    if (*(uint *)((long)pvVar1 + 0x18) < 2) {
      if (((conn->proto).ftpc.wait_data_conn & 1U) != 0) goto LAB_00482c44;
      if ((data->set).upload == true) {
        _Var8 = (data->set).prefer_ascii;
        newstate = FTP_STOR_TYPE;
      }
      else {
        *(undefined8 *)((long)pvVar1 + 0x20) = 0xffffffffffffffff;
        pSVar2 = conn->data;
        if (((pSVar2->state).use_range == true) &&
           (pcVar9 = (pSVar2->state).range, pcVar9 != (char *)0x0)) {
          local_d0 = pSVar2;
          local_d8 = strtol(pcVar9,(char **)&serv_conned,0);
          local_c8 = (void *)-local_d8;
          __nptr = (byte *)CONCAT71(uStack_b7,serv_conned);
          while ((uVar10 = (ulong)*__nptr, uVar10 != 0 &&
                 ((ppuVar4 = __ctype_b_loc(), uVar10 == 0x2d || (((*ppuVar4)[uVar10] & 0x2000) != 0)
                  )))) {
            __nptr = __nptr + 1;
          }
          lVar5 = strtol((char *)__nptr,(char **)&local_c0,0);
          lVar6 = -1;
          if (__nptr != local_c0) {
            lVar6 = lVar5;
          }
          if (lVar6 != -1 || local_d8 < 0) {
            pvVar7 = (void *)((lVar6 - local_d8) + 1);
            if (local_d8 < 0) {
              pvVar7 = local_c8;
            }
            (local_d0->req).maxdownload = (curl_off_t)pvVar7;
          }
          (local_d0->state).resume_from = local_d8;
          (conn->proto).ftpc.dont_check = true;
        }
        else {
          (pSVar2->req).maxdownload = -1;
        }
        if (((data->set).ftp_list_only == false) && ((conn->proto).ftpc.file != (char *)0x0)) {
          _Var8 = (data->set).prefer_ascii;
          newstate = FTP_RETR_TYPE;
        }
        else {
          if (*(int *)((long)pvVar1 + 0x18) != 0) goto LAB_00482e32;
          _Var8 = true;
          newstate = FTP_LIST_TYPE;
        }
      }
      CVar3 = ftp_nb_type(conn,_Var8,newstate);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
LAB_00482e32:
      CVar3 = ftp_multi_statemach(conn,&complete);
      *completep = (uint)complete;
      return CVar3;
    }
    if (CVar3 != CURLE_OK) goto LAB_00482cde;
  }
  else {
    CVar3 = ftp_multi_statemach(conn,&complete);
    *completep = (uint)complete;
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if ((conn->proto).ftpc.wait_data_conn == false) {
      return CURLE_OK;
    }
    *completep = 0;
    if (*(uint *)((long)pvVar1 + 0x18) < 2) {
LAB_00482c44:
      CVar3 = ReceivedServerConnect(conn,&serv_conned);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if (serv_conned == true) {
        CVar3 = AcceptServerConnect(conn);
        (conn->proto).ftpc.wait_data_conn = false;
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        CVar3 = InitiateTransfer(conn);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        *completep = 1;
      }
      return CURLE_OK;
    }
  }
  CVar3 = CURLE_OK;
  Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
LAB_00482cde:
  if ((conn->proto).ftpc.wait_data_conn == false) {
    *completep = 1;
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_do_more(struct connectdata *conn, int *completep)
{
  struct SessionHandle *data=conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;

  /* if the second connection isn't done yet, wait for it */
  if(!conn->bits.tcpconnect[SECONDARYSOCKET]) {
    if(conn->tunnel_state[SECONDARYSOCKET] == TUNNEL_CONNECT) {
      /* As we're in TUNNEL_CONNECT state now, we know the proxy name and port
         aren't used so we blank their arguments. TODO: make this nicer */
      result = Curl_proxyCONNECT(conn, SECONDARYSOCKET, NULL, 0);

      return result;
    }

    result = Curl_is_connected(conn, SECONDARYSOCKET, &connected);

    /* Ready to do more? */
    if(connected) {
      DEBUGF(infof(data, "DO-MORE connected phase starts\n"));
      if(conn->bits.proxy) {
        infof(data, "Connection to proxy confirmed\n");
        result = proxy_magic(conn, ftpc->newhost, ftpc->newport, &connected);
      }
    }
    else {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(conn);
      }
      return result;
    }
  }

  if(ftpc->state) {
    /* already in a state so skip the intial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(conn, &complete);

    *completep = (int)complete;

    /* if we got an error or if we don't wait for a data connection return
       immediately */
    if(result || (ftpc->wait_data_conn != TRUE))
      return result;

    if(ftpc->wait_data_conn)
      /* if we reach the end of the FTP state machine here, *complete will be
         TRUE but so is ftpc->wait_data_conn, which says we need to wait for
         the data connection and therefore we're not actually complete */
      *completep = 0;
  }

  if(ftp->transfer <= FTPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a file name was given
       so we'll do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn == TRUE) {
      bool serv_conned;

      result = ReceivedServerConnect(conn, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(conn);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(conn);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->set.upload) {
      result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(conn, &complete);
      *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = ftp_range(conn);
      if(result)
        ;
      else if(data->set.ftp_list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == FTPTRANSFER_BODY) {
          result = ftp_nb_type(conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(conn, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  if((result == CURLE_OK) && (ftp->transfer != FTPTRANSFER_BODY))
    /* no data to transfer. FIX: it feels like a kludge to have this here
       too! */
    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    DEBUGF(infof(data, "DO-MORE phase ends with %d\n", (int)result));
  }

  return result;
}